

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

void guess_comptype(char *file,int32 *ispipe,int32 *isgz)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int32 iVar4;
  
  sVar3 = strlen(file);
  *ispipe = 0;
  *isgz = 0;
  if (sVar3 < 3) {
    return;
  }
  pcVar1 = file + sVar3;
  if ((file[sVar3 - 2] != '.') ||
     (((iVar4 = 1, pcVar1[-1] != 'Z' || (*pcVar1 != '\0')) &&
      ((pcVar1[-1] != 'z' || (*pcVar1 != '\0')))))) {
    if (sVar3 == 3) {
      return;
    }
    iVar2 = strcmp(pcVar1 + -3,".gz");
    iVar4 = 2;
    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar1 + -3,".GZ"), iVar2 != 0)) {
      if (sVar3 < 5) {
        return;
      }
      iVar2 = strcmp(pcVar1 + -4,".bz2");
      iVar4 = 3;
      if ((iVar2 != 0) && (iVar2 = strcmp(pcVar1 + -4,".BZ2"), iVar2 != 0)) {
        return;
      }
    }
  }
  *ispipe = 1;
  *isgz = iVar4;
  return;
}

Assistant:

static void
guess_comptype(char const *file, int32 *ispipe, int32 *isgz)
{
    size_t k;

    k = strlen(file);
    *ispipe = 0;
    *isgz = COMP_NONE;
    if ((k > 2)
        && ((strcmp(file + k - 2, ".Z") == 0)
            || (strcmp(file + k - 2, ".z") == 0))) {
        *ispipe = 1;
        *isgz = COMP_COMPRESS;
    }
    else if ((k > 3) && ((strcmp(file + k - 3, ".gz") == 0)
                        || (strcmp(file + k - 3, ".GZ") == 0))) {
        *ispipe = 1;
        *isgz = COMP_GZIP;
    }
    else if ((k > 4) && ((strcmp(file + k - 4, ".bz2") == 0)
                        || (strcmp(file + k - 4, ".BZ2") == 0))) {
        *ispipe = 1;
        *isgz = COMP_BZIP2;
    }
}